

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alldiff.cpp
# Opt level: O0

bool __thiscall AllDiffBoundsImp<4>::filterlower(AllDiffBoundsImp<4> *this)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  int *piVar4;
  Lit *pLVar5;
  int64_t iVar6;
  undefined1 x;
  int iVar7;
  long in_RDI;
  int l_1;
  int k_1;
  int m;
  int l;
  int k;
  int hall_min;
  int hall_max;
  Clause *r;
  int maxrank;
  int minrank;
  int z;
  int w;
  int j;
  int i;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  Propagator *in_stack_ffffffffffffff40;
  BoolView *in_stack_ffffffffffffff48;
  anon_union_8_2_743a5d44_for_Reason_0 in_stack_ffffffffffffff50;
  Reason local_80;
  int local_74;
  Reason local_70;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  Clause *local_30;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  
  for (local_14 = 1; local_14 <= *(int *)(in_RDI + 0x58) + 1; local_14 = local_14 + 1) {
    iVar1 = *(int *)(*(long *)(in_RDI + 0x60) + (long)local_14 * 4);
    lVar2 = *(long *)(in_RDI + 0x60);
    iVar7 = local_14 + -1;
    *(int *)(*(long *)(in_RDI + 0x78) + (long)local_14 * 4) = iVar7;
    *(int *)(*(long *)(in_RDI + 0x68) + (long)local_14 * 4) = iVar7;
    *(int *)(*(long *)(in_RDI + 0x70) + (long)local_14 * 4) =
         iVar1 - *(int *)(lVar2 + (long)iVar7 * 4);
    *(undefined4 *)(*(long *)(in_RDI + 0x80) + (long)local_14 * 4) = 0xffffffff;
  }
  local_14 = 0;
  do {
    if (*(int *)(in_RDI + 0x28) <= local_14) {
      return true;
    }
    local_24 = *(int *)(*(long *)(in_RDI + 0x40) +
                        (long)*(int *)(*(long *)(in_RDI + 0x50) + (long)local_14 * 4) * 0x14 + 0xc);
    local_28 = *(int *)(*(long *)(in_RDI + 0x40) +
                        (long)*(int *)(*(long *)(in_RDI + 0x50) + (long)local_14 * 4) * 0x14 + 0x10)
    ;
    lVar2 = *(long *)(in_RDI + 0x68);
    local_20 = pathmax(*(int **)(in_RDI + 0x68),local_24 + 1);
    iVar1 = *(int *)(lVar2 + (long)local_20 * 4);
    *(undefined4 *)
     (*(long *)(in_RDI + 0x40) +
     (long)*(int *)(*(long *)(in_RDI + 0x50) + (long)local_14 * 4) * 0x14) =
         *(undefined4 *)(*(long *)(in_RDI + 0x80) + (long)local_20 * 4);
    *(undefined4 *)(*(long *)(in_RDI + 0x80) + (long)local_20 * 4) =
         *(undefined4 *)(*(long *)(in_RDI + 0x50) + (long)local_14 * 4);
    iVar7 = *(int *)(*(long *)(in_RDI + 0x70) + (long)local_20 * 4) + -1;
    *(int *)(*(long *)(in_RDI + 0x70) + (long)local_20 * 4) = iVar7;
    local_18 = iVar1;
    if (iVar7 == 0) {
      lVar2 = *(long *)(in_RDI + 0x68);
      piVar4 = *(int **)(in_RDI + 0x68);
      *(int *)(*(long *)(in_RDI + 0x68) + (long)local_20 * 4) = local_20 + 1;
      local_20 = pathmax(piVar4,local_20 + 1);
      *(int *)(lVar2 + (long)local_20 * 4) = iVar1;
    }
    pathset(*(int **)(in_RDI + 0x68),local_24 + 1,local_20,local_20);
    if (local_24 < *(int *)(*(long *)(in_RDI + 0x78) + (long)local_24 * 4)) {
      local_30 = (Clause *)0x0;
      lVar2 = *(long *)(in_RDI + 0x60);
      local_1c = pathmax(*(int **)(in_RDI + 0x78),
                         *(int *)(*(long *)(in_RDI + 0x78) + (long)local_24 * 4));
      local_34 = *(int *)(lVar2 + (long)local_1c * 4);
      if ((so.lazy & 1U) != 0) {
        local_38 = *(int *)(*(long *)(in_RDI + 0x60) + (long)local_24 * 4);
        local_3c = local_1c;
        while (local_38 < *(int *)(*(long *)(in_RDI + 0x60) + (long)local_3c * 4)) {
          for (local_40 = *(int *)(*(long *)(in_RDI + 0x80) + (long)local_3c * 4); -1 < local_40;
              local_40 = *(int *)(*(long *)(in_RDI + 0x40) + (long)local_40 * 0x14)) {
            piVar4 = std::min<int>(&local_38,
                                   (int *)(*(long *)(in_RDI + 0x40) + (long)local_40 * 0x14 + 4));
            local_38 = *piVar4;
          }
          local_3c = local_3c + -1;
        }
        local_30 = ::Reason_new((int)((ulong)in_stack_ffffffffffffff40 >> 0x20));
        local_48 = (int)IntView<4>::getLit((IntView<4> *)in_stack_ffffffffffffff48,
                                           (int64_t)in_stack_ffffffffffffff40,
                                           in_stack_ffffffffffffff3c);
        local_44 = (int)operator~((Lit)0x1a8b58);
        pLVar5 = Clause::operator[]((Clause *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
        pLVar5->x = local_44;
        local_4c = 3;
        local_50 = local_1c;
        while (local_38 < *(int *)(*(long *)(in_RDI + 0x60) + (long)local_50 * 4)) {
          for (local_54 = *(int *)(*(long *)(in_RDI + 0x80) + (long)local_50 * 4); -1 < local_54;
              local_54 = *(int *)(*(long *)(in_RDI + 0x40) + (long)local_54 * 0x14)) {
            local_5c = (int)IntView<4>::getLit((IntView<4> *)in_stack_ffffffffffffff48,
                                               (int64_t)in_stack_ffffffffffffff40,
                                               in_stack_ffffffffffffff3c);
            local_58 = (int)operator~((Lit)0x1a8c02);
            local_4c = local_4c + 1;
            pLVar5 = Clause::operator[]((Clause *)in_stack_ffffffffffffff40,
                                        in_stack_ffffffffffffff3c);
            pLVar5->x = local_58;
            local_64 = (int)IntView<4>::getLit((IntView<4> *)in_stack_ffffffffffffff48,
                                               (int64_t)in_stack_ffffffffffffff40,
                                               in_stack_ffffffffffffff3c);
            local_60 = (int)operator~((Lit)0x1a8c62);
            local_4c = local_4c + 1;
            pLVar5 = Clause::operator[]((Clause *)in_stack_ffffffffffffff40,
                                        in_stack_ffffffffffffff3c);
            pLVar5->x = local_60;
          }
          local_50 = local_50 + -1;
        }
      }
      bVar3 = BoolView::isFixed((BoolView *)0x1a8cc8);
      if (bVar3) {
        local_68 = (int)BoolView::getValLit((BoolView *)
                                            CONCAT44(in_stack_ffffffffffffff3c,
                                                     in_stack_ffffffffffffff38));
        pLVar5 = Clause::operator[]((Clause *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
        pLVar5->x = local_68;
        in_stack_ffffffffffffff48 =
             (BoolView *)
             (*(long *)(in_RDI + 0x30) +
             (long)*(int *)(*(long *)(in_RDI + 0x50) + (long)local_14 * 4) * 0x10);
        in_stack_ffffffffffffff50 = (anon_union_8_2_743a5d44_for_Reason_0)(long)local_34;
        Reason::Reason(&local_70,local_30);
        bVar3 = IntView<4>::setMin((IntView<4> *)in_stack_ffffffffffffff48,
                                   (int64_t)in_stack_ffffffffffffff40,
                                   (Reason)in_stack_ffffffffffffff50,
                                   SUB41((uint)in_stack_ffffffffffffff3c >> 0x18,0));
        if (((bVar3 ^ 0xffU) & 1) != 0) {
          return false;
        }
        *(int *)(*(long *)(in_RDI + 0x40) +
                 (long)*(int *)(*(long *)(in_RDI + 0x50) + (long)local_14 * 4) * 0x14 + 4) =
             local_34;
        iVar6 = IntView<4>::getMin((IntView<4> *)in_stack_ffffffffffffff40);
        if (local_34 < iVar6) {
          Propagator::pushInQueue(in_stack_ffffffffffffff40);
        }
        pathset(*(int **)(in_RDI + 0x78),local_24,local_1c,local_1c);
      }
      else {
        iVar6 = IntView<4>::getMax((IntView<4> *)in_stack_ffffffffffffff40);
        if (iVar6 < local_34) {
          local_74 = (int)IntView<4>::getLit((IntView<4> *)in_stack_ffffffffffffff48,
                                             (int64_t)in_stack_ffffffffffffff40,
                                             in_stack_ffffffffffffff3c);
          pLVar5 = Clause::operator[]((Clause *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c)
          ;
          pLVar5->x = local_74;
          x = (undefined1)((ulong)(in_RDI + 0x18) >> 0x38);
          Reason::Reason(&local_80,local_30);
          bVar3 = BoolView::setVal(in_stack_ffffffffffffff48,(bool)x,
                                   (Reason)in_stack_ffffffffffffff50);
          return bVar3;
        }
      }
    }
    if (*(int *)(*(long *)(in_RDI + 0x70) + (long)local_20 * 4) ==
        *(int *)(*(long *)(in_RDI + 0x60) + (long)local_20 * 4) -
        *(int *)(*(long *)(in_RDI + 0x60) + (long)local_28 * 4)) {
      pathset(*(int **)(in_RDI + 0x78),*(int *)(*(long *)(in_RDI + 0x78) + (long)local_28 * 4),
              local_18 + -1,local_28);
      *(int *)(*(long *)(in_RDI + 0x78) + (long)local_28 * 4) = local_18 + -1;
    }
    local_14 = local_14 + 1;
  } while( true );
}

Assistant:

bool filterlower() {
		int i;
		int j;
		int w;
		int z;

		// fprintf(stderr, "AllDiffBounds::filterlower()\n");
		for (i = 1; i <= nb + 1; i++) {
			d[i] = bounds[i] - bounds[t[i] = h[i] = i - 1];
			bucket[i] = -1;  // this could perhaps be avoided
		}
		for (i = 0; i < sz; i++) {  // visit intervals in increasing max order
			const int minrank = iv[maxsorted[i]].minrank;
			const int maxrank = iv[maxsorted[i]].maxrank;
			// fprintf(stderr, "var %d [%d, %d)\n", maxsorted[i], bounds[minrank], bounds[maxrank]);
			j = t[z = pathmax(t, minrank + 1)];
			iv[maxsorted[i]].next = bucket[z];
			bucket[z] = maxsorted[i];
			if (--d[z] == 0) {
				t[z = pathmax(t, t[z] = z + 1)] = j;
			}
			pathset(t, minrank + 1, z, z);  // path compression
			// if (d[z] < bounds[z]-bounds[maxrank]) return false; // no solution
			if (h[minrank] > minrank) {
				Clause* r = nullptr;
				const int hall_max = bounds[w = pathmax(h, h[minrank])];
				if (so.lazy) {
					int hall_min = bounds[minrank];
					// here both k and hall_min are decreasing, stop when k catches up
					for (int k = w; bounds[k] > hall_min; --k) {
						for (int l = bucket[k]; l >= 0; l = iv[l].next) {
							hall_min = std::min(hall_min, iv[l].min);
						}
					}
					// fprintf(stderr, "  in hall [%d, %d):\n", hall_min, hall_max);
					r = Reason_new(3 + (hall_max - hall_min) * 2);
					(*r)[1] = ~x[maxsorted[i]].getLit(hall_min, LR_GE);
					int m = 3;
					for (int k = w; bounds[k] > hall_min; --k) {
						for (int l = bucket[k]; l >= 0; l = iv[l].next) {
							// fprintf(stderr, "    var %d [%d, %d)\n", l, iv[l].min, iv[l].max);
							(*r)[m++] = ~x[l].getLit(hall_min, LR_GE);
							(*r)[m++] = ~x[l].getLit(hall_max - 1, LR_LE);
						}
					}
					assert(m == 3 + (hall_max - hall_min) * 2);
				}
				if (b.isFixed()) {
					assert(b.isTrue());
					(*r)[2] = b.getValLit();
					if (!x[maxsorted[i]].setMin(hall_max, r)) {
						// fprintf(stderr, "  failure\n");
						return false;
					}
					iv[maxsorted[i]].min = hall_max;
					if (x[maxsorted[i]].getMin() > hall_max) {
						// fprintf(stderr, "  hole, var %d [%d, %d)\n", maxsorted[i],
						// static_cast<int>(x[maxsorted[i]].getMin()), iv[maxsorted[i]].max);
						pushInQueue();  // hole in domain
					}
					pathset(h, minrank, w, w);  // path compression
				} else {
					if (x[maxsorted[i]].getMax() < hall_max) {
						(*r)[2] = x[maxsorted[i]].getLit(hall_max, LR_GE);
						return b.setVal(false, r);
					}
				}
			}
			if (d[z] == bounds[z] - bounds[maxrank]) {
				// fprintf(stderr, "  new hall [%d, %d)\n", bounds[j], bounds[maxrank]);
				pathset(h, h[maxrank], j - 1, maxrank);  // mark hall interval
				h[maxrank] = j - 1;
			}
		}
		return true;
	}